

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O1

void __thiscall CGraphics_Threaded::LinesDraw(CGraphics_Threaded *this,CLineItem *pArray,int Num)

{
  CColor *pCVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/client/graphics_threaded.cpp"
                 ,0xfb,(uint)(this->m_Drawing == 2),"called Graphics()->LinesDraw without begin");
  if (0 < Num) {
    lVar6 = 1;
    lVar7 = 0;
    do {
      iVar8 = this->m_NumVertices;
      iVar5 = (int)lVar7 + iVar8;
      this->m_aVertices[iVar5].m_Pos = *(CPoint *)((long)pArray + lVar6 * 8 + -8);
      this->m_aVertices[iVar5].m_Tex.i = this->m_aTexture[0].i;
      fVar2 = this->m_aTexture[0].v;
      this->m_aVertices[iVar5].m_Tex.u = this->m_aTexture[0].u;
      this->m_aVertices[iVar5].m_Tex.v = fVar2;
      fVar2 = this->m_aColor[0].g;
      fVar3 = this->m_aColor[0].b;
      fVar4 = this->m_aColor[0].a;
      pCVar1 = &this->m_aVertices[iVar5].m_Color;
      pCVar1->r = this->m_aColor[0].r;
      pCVar1->g = fVar2;
      pCVar1->b = fVar3;
      pCVar1->a = fVar4;
      iVar8 = iVar8 + (int)lVar6;
      this->m_aVertices[iVar8].m_Pos = *(CPoint *)(&pArray->m_X0 + lVar6 * 2);
      fVar2 = this->m_aTexture[1].v;
      this->m_aVertices[iVar8].m_Tex.u = this->m_aTexture[1].u;
      this->m_aVertices[iVar8].m_Tex.v = fVar2;
      this->m_aVertices[iVar8].m_Tex.i = this->m_aTexture[1].i;
      fVar2 = this->m_aColor[1].g;
      fVar3 = this->m_aColor[1].b;
      fVar4 = this->m_aColor[1].a;
      pCVar1 = &this->m_aVertices[this->m_NumVertices + (int)lVar6].m_Color;
      pCVar1->r = this->m_aColor[1].r;
      pCVar1->g = fVar2;
      pCVar1->b = fVar3;
      pCVar1->a = fVar4;
      lVar6 = lVar6 + 2;
      lVar7 = lVar7 + 2;
    } while ((ulong)(uint)Num * 2 != lVar7);
  }
  iVar8 = Num * 2 + this->m_NumVertices;
  this->m_NumVertices = iVar8;
  if (0x7fff < iVar8 + Num * 2) {
    FlushVertices(this);
    return;
  }
  return;
}

Assistant:

void CGraphics_Threaded::LinesDraw(const CLineItem *pArray, int Num)
{
	dbg_assert(m_Drawing == DRAWING_LINES, "called Graphics()->LinesDraw without begin");

	for(int i = 0; i < Num; ++i)
	{
		m_aVertices[m_NumVertices + 2*i].m_Pos.x = pArray[i].m_X0;
		m_aVertices[m_NumVertices + 2*i].m_Pos.y = pArray[i].m_Y0;
		m_aVertices[m_NumVertices + 2*i].m_Tex = m_aTexture[0];
		m_aVertices[m_NumVertices + 2*i].m_Color = m_aColor[0];

		m_aVertices[m_NumVertices + 2*i + 1].m_Pos.x = pArray[i].m_X1;
		m_aVertices[m_NumVertices + 2*i + 1].m_Pos.y = pArray[i].m_Y1;
		m_aVertices[m_NumVertices + 2*i + 1].m_Tex = m_aTexture[1];
		m_aVertices[m_NumVertices + 2*i + 1].m_Color = m_aColor[1];
	}

	AddVertices(2*Num);
}